

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed,int timeProperty,HelicsError *err)

{
  undefined1 auVar1 [16];
  int iVar2;
  Federate *pFVar3;
  int extraout_var;
  HelicsTime HVar4;
  
  pFVar3 = getFed(fed,err);
  if (pFVar3 == (Federate *)0x0) {
    HVar4 = -1.785e+39;
  }
  else {
    iVar2 = (*pFVar3->_vptr_Federate[7])(pFVar3,timeProperty);
    if (CONCAT44(extraout_var,iVar2) == 0x7fffffffffffffff) {
      HVar4 = 9223372036.854774;
    }
    else {
      auVar1._8_8_ = (long)extraout_var >> 0x1f;
      auVar1._0_8_ = CONCAT44(extraout_var,iVar2);
      HVar4 = (double)SUB168(auVar1 % SEXT816(1000000000),0) * 1e-09 +
              (double)SUB168(auVar1 / SEXT816(1000000000),0);
    }
  }
  return HVar4;
}

Assistant:

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed, int timeProperty, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeprop = fedObj->getTimeProperty(timeProperty);

        return (timeprop < helics::Time::maxVal()) ? static_cast<double>(timeprop) : HELICS_TIME_MAXTIME;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}